

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

WeierstrassPoint * ecdsa_public(mp_int *private_key,ssh_keyalg *alg)

{
  int *piVar1;
  mp_int *n;
  WeierstrassPoint *pWVar2;
  
  piVar1 = (int *)(**alg->extra)();
  if (*piVar1 == 0) {
    n = mp_mod(private_key,*(mp_int **)(piVar1 + 10));
    pWVar2 = ecc_weierstrass_multiply(*(WeierstrassPoint **)(piVar1 + 0xe),n);
    mp_free(n);
    return pWVar2;
  }
  __assert_fail("curve->type == EC_WEIERSTRASS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x152,"WeierstrassPoint *ecdsa_public(mp_int *, const ssh_keyalg *)");
}

Assistant:

WeierstrassPoint *ecdsa_public(mp_int *private_key, const ssh_keyalg *alg)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_WEIERSTRASS);

    mp_int *priv_reduced = mp_mod(private_key, curve->p);
    WeierstrassPoint *toret = ecc_weierstrass_multiply(
        curve->w.G, priv_reduced);
    mp_free(priv_reduced);
    return toret;
}